

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O0

int Kf_HashFindOrAdd(Kf_Set_t *p,int i)

{
  int iVar1;
  int iVar2;
  int k;
  int i_local;
  Kf_Set_t *p_local;
  
  iVar2 = Kf_HashLookup(p,i);
  if (iVar2 == -1) {
    p_local._4_4_ = 0;
  }
  else if (p->nTEntries == (uint)p->nLutSize) {
    p_local._4_4_ = 1;
  }
  else {
    if (p->pTable[iVar2] != 0) {
      __assert_fail("p->pTable[k] == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaKf.c"
                    ,0x186,"int Kf_HashFindOrAdd(Kf_Set_t *, int)");
    }
    p->pTable[iVar2] = i;
    p->pPlace[p->nTEntries] = iVar2;
    iVar1 = p->nTEntries;
    p->nTEntries = iVar1 + 1;
    p->pValue[iVar2] = iVar1;
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

static inline int Kf_HashFindOrAdd( Kf_Set_t * p, int i )
{
    int k = Kf_HashLookup( p, i );
    if ( k == -1 )
        return 0;
    if ( p->nTEntries == p->nLutSize )
        return 1;
    assert( p->pTable[k] == 0 );
    p->pTable[k] = i;
    p->pPlace[p->nTEntries] = k;
    p->pValue[k] = p->nTEntries++;
    return 0;
}